

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::SMdivideREM(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  allocator<char> local_49;
  string local_48;
  
  requireDStackDepth(this,3,"SM/REM");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"SM/REM: zero divisor",&local_49);
    throwCppExceptionMessage(this,&local_48,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,0,(uint)(CONCAT44(uVar3,uVar2) / (long)(int)uVar1));
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)(CONCAT44(uVar3,uVar2) % (long)(int)uVar1));
  return;
}

Assistant:

void SMdivideREM(){
			REQUIRE_DSTACK_DEPTH(3, "SM/REM");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) }; dStack.pop();
			RUNTIME_ERROR_IF(n1.data_.Cells.lo == 0, "SM/REM: zero divisor", errorDivisionByZero);
			SDCell d1(dStack.getTop(1),dStack.getTop());
			SDCell quotent(d1.data_.Dcells / n1.data_.Dcells); // n3
			SDCell reminder(d1.data_.Dcells % n1.data_.Dcells); // n2
			dStack.setTop(0, quotent.data_.Cells.lo);
			dStack.setTop(1, reminder.data_.Cells.lo);
		}